

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O0

void __thiscall slang::driver::Driver::addLibraryFiles(Driver *this,string_view pattern)

{
  size_type sVar1;
  char *in_RDX;
  size_t in_RSI;
  undefined8 in_RDI;
  char __c;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  SourceLoader *unaff_retaddr;
  undefined1 in_stack_00000008 [16];
  string_view in_stack_00000018;
  size_type index;
  string_view libraryName;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff90;
  size_type in_stack_ffffffffffffffa0;
  size_type in_stack_ffffffffffffffa8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb0;
  char *local_48;
  size_t local_40;
  char *local_38;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  size_t local_10;
  char *local_8;
  
  __c = (char)((ulong)in_RDI >> 0x38);
  local_10 = in_RSI;
  local_8 = in_RDX;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28);
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                    (in_stack_ffffffffffffff90,__c,0x2cda69);
  if (sVar1 != 0xffffffffffffffff) {
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0
                      );
    local_40 = bVar2._M_len;
    local_28._M_len = local_40;
    local_38 = bVar2._M_str;
    local_28._M_str = local_38;
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0
                      );
    local_10 = bVar2._M_len;
    local_48 = bVar2._M_str;
    local_8 = local_48;
  }
  SourceLoader::addLibraryFiles(unaff_retaddr,in_stack_00000018,(string_view)in_stack_00000008);
  return;
}

Assistant:

void Driver::addLibraryFiles(std::string_view pattern) {
    // Parse the pattern; there's an optional leading library name
    // followed by an equals sign. If not there, we use the default
    // library (represented by the empty string).
    std::string_view libraryName;
    auto index = pattern.find_first_of('=');
    if (index != std::string_view::npos) {
        libraryName = pattern.substr(0, index);
        pattern = pattern.substr(index + 1);
    }
    sourceLoader.addLibraryFiles(libraryName, pattern);
}